

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_26382a::SwiftCompilerShellCommand::writeOutputFileMap
          (SwiftCompilerShellCommand *this,TaskInterface ti,StringRef outputFileMapPath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depsFiles_out)

{
  StringRef Filename;
  bool bVar1;
  Style SVar2;
  size_type sVar3;
  size_type sVar4;
  BuildSystemImpl *this_00;
  BuildSystemDelegate *pBVar5;
  undefined8 uVar6;
  raw_ostream *prVar7;
  const_reference pvVar8;
  void *extraout_RDX;
  SmallString<16U> *in;
  SmallString<16U> *in_00;
  SmallString<16U> *in_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_02;
  SmallString<16U> *in_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_04;
  SmallString<16U> *in_05;
  SmallString<16U> *in_06;
  int __fd;
  char *Str;
  TaskInterface ti_00;
  StringRef path;
  StringRef path_00;
  string local_6b0;
  string local_690;
  string local_670;
  StringRef local_650;
  string local_640;
  string local_620;
  Twine local_600;
  Twine local_5e8;
  Twine local_5d0;
  Twine local_5b8;
  undefined1 local_5a0 [8];
  SmallString<16U> depsPath_1;
  Twine local_560;
  Twine local_548;
  Twine local_530;
  Twine local_518;
  undefined1 local_500 [8];
  SmallString<16U> swiftDepsPath;
  Twine local_4c8;
  Twine local_4b0;
  Twine local_498;
  undefined1 local_480 [8];
  SmallString<16U> partialModulePath;
  char *local_458;
  undefined1 local_450 [8];
  StringRef sourceStem;
  char *local_438;
  undefined1 local_430 [8];
  StringRef objectDir;
  value_type object_1;
  value_type source;
  undefined1 local_3d8 [4];
  uint i;
  string local_3b8;
  string local_398;
  Twine local_378;
  Twine local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  Twine local_328;
  Twine local_310;
  undefined1 local_2f8 [8];
  SmallString<16U> object;
  string local_2c8;
  Twine local_2a8;
  Twine local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  Twine local_258;
  Twine local_240;
  undefined1 local_228 [8];
  SmallString<16U> depsPath;
  Twine local_1f0;
  Twine local_1d8;
  Twine local_1c0;
  undefined1 local_1a8 [8];
  SmallString<16U> masterDepsPath;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined8 local_120;
  size_t local_110;
  void *local_108;
  SwiftCompilerShellCommand *local_100;
  char *local_f8;
  undefined1 local_f0 [8];
  raw_fd_ostream os;
  error_code ec;
  SmallString<16U> data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depsFiles_out_local;
  SwiftCompilerShellCommand *this_local;
  StringRef outputFileMapPath_local;
  TaskInterface ti_local;
  
  outputFileMapPath_local.Data = (char *)outputFileMapPath.Length;
  this_local = (SwiftCompilerShellCommand *)outputFileMapPath.Data;
  outputFileMapPath_local.Length = (size_t)ti.impl;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->sourcesList);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->objectsList);
  if (sVar3 == sVar4) {
    llvm::SmallString<16U>::SmallString((SmallString<16U> *)&ec._M_cat);
    std::error_code::error_code((error_code *)&os.SupportsSeeking);
    local_100 = this_local;
    local_f8 = outputFileMapPath_local.Data;
    Filename.Length = (size_t)outputFileMapPath_local.Data;
    Filename.Data = (char *)this_local;
    llvm::raw_fd_ostream::raw_fd_ostream
              ((raw_fd_ostream *)local_f0,Filename,(error_code *)&os.SupportsSeeking,F_Text);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)&os.SupportsSeeking);
    if (bVar1) {
      local_110 = outputFileMapPath_local.Length;
      ti_00.ctx = extraout_RDX;
      ti_00.impl = ti.ctx;
      local_108 = ti.ctx;
      this_00 = getBuildSystem((anon_unknown_dwarf_26382a *)outputFileMapPath_local.Length,ti_00);
      pBVar5 = BuildSystemImpl::getDelegate(this_00);
      llvm::StringRef::str_abi_cxx11_(&local_180,(StringRef *)&this_local);
      std::operator+(&local_160,"unable to create output file map: \'",&local_180);
      std::operator+(&local_140,&local_160,"\'");
      local_120 = std::__cxx11::string::data();
      uVar6 = std::__cxx11::string::length();
      (*pBVar5->_vptr_BuildSystemDelegate[0xb])(pBVar5,this,local_120,uVar6);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      ti_local.ctx._7_1_ = false;
      masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts
      [0xc].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x1;
      masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts
      [0xd].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts
      [0xe].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts
      [0xf].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
    }
    else {
      llvm::raw_ostream::operator<<((raw_ostream *)local_f0,"{\n");
      llvm::SmallString<16U>::SmallString((SmallString<16U> *)local_1a8);
      llvm::Twine::Twine(&local_1c0,&this->tempsPath);
      llvm::Twine::Twine(&local_1d8,"master.swiftdeps");
      llvm::Twine::Twine(&local_1f0,"");
      llvm::Twine::Twine((Twine *)(depsPath.super_SmallVector<char,_16U>.
                                   super_SmallVectorStorage<char,_16U>.InlineElts + 8),"");
      llvm::sys::path::append
                ((SmallVectorImpl<char> *)local_1a8,&local_1c0,&local_1d8,&local_1f0,
                 (Twine *)(depsPath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>
                           .InlineElts + 8));
      llvm::raw_ostream::operator<<((raw_ostream *)local_f0,"  \"\": {\n");
      if ((this->enableWholeModuleOptimization & 1U) != 0) {
        llvm::SmallString<16U>::SmallString((SmallString<16U> *)local_228);
        llvm::Twine::Twine(&local_240,&this->tempsPath);
        std::operator+(&local_278,&this->moduleName,".d");
        llvm::Twine::Twine(&local_258,&local_278);
        llvm::Twine::Twine(&local_290,"");
        llvm::Twine::Twine(&local_2a8,"");
        llvm::sys::path::append
                  ((SmallVectorImpl<char> *)local_228,&local_240,&local_258,&local_290,&local_2a8);
        std::__cxx11::string::~string((string *)&local_278);
        join_0x00000010_0x00000000_ = llvm::SmallString<16U>::str((SmallString<16U> *)local_228);
        llvm::StringRef::operator_cast_to_string
                  (&local_2c8,
                   (StringRef *)
                   (object.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                    InlineElts + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(depsFiles_out,&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        llvm::SmallString<16U>::SmallString((SmallString<16U> *)local_2f8);
        llvm::Twine::Twine(&local_310,&this->tempsPath);
        std::operator+(&local_348,&this->moduleName,".o");
        llvm::Twine::Twine(&local_328,&local_348);
        llvm::Twine::Twine(&local_360,"");
        llvm::Twine::Twine(&local_378,"");
        llvm::sys::path::append
                  ((SmallVectorImpl<char> *)local_2f8,&local_310,&local_328,&local_360,&local_378);
        std::__cxx11::string::~string((string *)&local_348);
        prVar7 = llvm::raw_ostream::operator<<((raw_ostream *)local_f0,"    \"dependencies\": \"");
        llbuild::basic::escapeForJSON<llvm::SmallString<16u>>(&local_398,(basic *)local_228,in);
        prVar7 = llvm::raw_ostream::operator<<(prVar7,&local_398);
        llvm::raw_ostream::operator<<(prVar7,"\",\n");
        std::__cxx11::string::~string((string *)&local_398);
        prVar7 = llvm::raw_ostream::operator<<((raw_ostream *)local_f0,"    \"object\": \"");
        llbuild::basic::escapeForJSON<llvm::SmallString<16u>>(&local_3b8,(basic *)local_2f8,in_00);
        prVar7 = llvm::raw_ostream::operator<<(prVar7,&local_3b8);
        llvm::raw_ostream::operator<<(prVar7,"\",\n");
        std::__cxx11::string::~string((string *)&local_3b8);
        llvm::SmallString<16U>::~SmallString((SmallString<16U> *)local_2f8);
        llvm::SmallString<16U>::~SmallString((SmallString<16U> *)local_228);
      }
      prVar7 = llvm::raw_ostream::operator<<
                         ((raw_ostream *)local_f0,"    \"swift-dependencies\": \"");
      llbuild::basic::escapeForJSON<llvm::SmallString<16u>>
                ((string *)local_3d8,(basic *)local_1a8,in_01);
      prVar7 = llvm::raw_ostream::operator<<(prVar7,(string *)local_3d8);
      llvm::raw_ostream::operator<<(prVar7,"\"\n");
      std::__cxx11::string::~string((string *)local_3d8);
      llvm::raw_ostream::operator<<((raw_ostream *)local_f0,"  },\n");
      source.field_2._12_4_ = 0;
      while( true ) {
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->sourcesList);
        if ((uint)source.field_2._12_4_ == sVar3) break;
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->sourcesList,(ulong)(uint)source.field_2._12_4_);
        std::__cxx11::string::string((string *)(object_1.field_2._M_local_buf + 8),(string *)pvVar8)
        ;
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->objectsList,(ulong)(uint)source.field_2._12_4_);
        std::__cxx11::string::string((string *)&objectDir.Length,(string *)pvVar8);
        sourceStem.Length = std::__cxx11::string::data();
        SVar2 = std::__cxx11::string::length();
        path.Length = 2;
        path.Data = local_438;
        _local_430 = llvm::sys::path::parent_path((path *)sourceStem.Length,path,SVar2);
        partialModulePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
        InlineElts._8_8_ = std::__cxx11::string::data();
        SVar2 = std::__cxx11::string::length();
        path_00.Length = 2;
        path_00.Data = local_458;
        _local_450 = llvm::sys::path::stem
                               ((path *)partialModulePath.super_SmallVector<char,_16U>.
                                        super_SmallVectorStorage<char,_16U>.InlineElts._8_8_,path_00
                                ,SVar2);
        llvm::SmallString<16U>::SmallString((SmallString<16U> *)local_480);
        llvm::Twine::Twine(&local_498,(StringRef *)local_430);
        llvm::operator+(&local_4b0,(StringRef *)local_450,"~partial.swiftmodule");
        llvm::Twine::Twine(&local_4c8,"");
        llvm::Twine::Twine((Twine *)(swiftDepsPath.super_SmallVector<char,_16U>.
                                     super_SmallVectorStorage<char,_16U>.InlineElts + 8),"");
        llvm::sys::path::append
                  ((SmallVectorImpl<char> *)local_480,&local_498,&local_4b0,&local_4c8,
                   (Twine *)(swiftDepsPath.super_SmallVector<char,_16U>.
                             super_SmallVectorStorage<char,_16U>.InlineElts + 8));
        llvm::SmallString<16U>::SmallString((SmallString<16U> *)local_500);
        llvm::Twine::Twine(&local_518,(StringRef *)local_430);
        llvm::operator+(&local_530,(StringRef *)local_450,".swiftdeps");
        llvm::Twine::Twine(&local_548,"");
        llvm::Twine::Twine(&local_560,"");
        llvm::sys::path::append
                  ((SmallVectorImpl<char> *)local_500,&local_518,&local_530,&local_548,&local_560);
        prVar7 = llvm::raw_ostream::operator<<((raw_ostream *)local_f0,"  \"");
        llbuild::basic::escapeForJSON<std::__cxx11::string>
                  ((string *)
                   (depsPath_1.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                    InlineElts + 8),(basic *)(object_1.field_2._M_local_buf + 8),in_02);
        prVar7 = llvm::raw_ostream::operator<<
                           (prVar7,(string *)
                                   (depsPath_1.super_SmallVector<char,_16U>.
                                    super_SmallVectorStorage<char,_16U>.InlineElts + 8));
        llvm::raw_ostream::operator<<(prVar7,"\": {\n");
        std::__cxx11::string::~string
                  ((string *)
                   (depsPath_1.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                    InlineElts + 8));
        if ((this->enableWholeModuleOptimization & 1U) == 0) {
          llvm::SmallString<16U>::SmallString((SmallString<16U> *)local_5a0);
          llvm::Twine::Twine(&local_5b8,(StringRef *)local_430);
          llvm::operator+(&local_5d0,(StringRef *)local_450,".d");
          llvm::Twine::Twine(&local_5e8,"");
          llvm::Twine::Twine(&local_600,"");
          llvm::sys::path::append
                    ((SmallVectorImpl<char> *)local_5a0,&local_5b8,&local_5d0,&local_5e8,&local_600)
          ;
          prVar7 = llvm::raw_ostream::operator<<((raw_ostream *)local_f0,"    \"dependencies\": \"")
          ;
          llbuild::basic::escapeForJSON<llvm::SmallString<16u>>(&local_620,(basic *)local_5a0,in_03)
          ;
          prVar7 = llvm::raw_ostream::operator<<(prVar7,&local_620);
          llvm::raw_ostream::operator<<(prVar7,"\",\n");
          std::__cxx11::string::~string((string *)&local_620);
          local_650 = llvm::SmallString<16U>::str((SmallString<16U> *)local_5a0);
          llvm::StringRef::operator_cast_to_string(&local_640,&local_650);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(depsFiles_out,&local_640);
          std::__cxx11::string::~string((string *)&local_640);
          llvm::SmallString<16U>::~SmallString((SmallString<16U> *)local_5a0);
        }
        prVar7 = llvm::raw_ostream::operator<<((raw_ostream *)local_f0,"    \"object\": \"");
        llbuild::basic::escapeForJSON<std::__cxx11::string>
                  (&local_670,(basic *)&objectDir.Length,in_04);
        prVar7 = llvm::raw_ostream::operator<<(prVar7,&local_670);
        llvm::raw_ostream::operator<<(prVar7,"\",\n");
        std::__cxx11::string::~string((string *)&local_670);
        prVar7 = llvm::raw_ostream::operator<<((raw_ostream *)local_f0,"    \"swiftmodule\": \"");
        llbuild::basic::escapeForJSON<llvm::SmallString<16u>>(&local_690,(basic *)local_480,in_05);
        prVar7 = llvm::raw_ostream::operator<<(prVar7,&local_690);
        llvm::raw_ostream::operator<<(prVar7,"\",\n");
        std::__cxx11::string::~string((string *)&local_690);
        prVar7 = llvm::raw_ostream::operator<<
                           ((raw_ostream *)local_f0,"    \"swift-dependencies\": \"");
        llbuild::basic::escapeForJSON<llvm::SmallString<16u>>(&local_6b0,(basic *)local_500,in_06);
        prVar7 = llvm::raw_ostream::operator<<(prVar7,&local_6b0);
        llvm::raw_ostream::operator<<(prVar7,"\"\n");
        std::__cxx11::string::~string((string *)&local_6b0);
        prVar7 = llvm::raw_ostream::operator<<((raw_ostream *)local_f0,"  }");
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->sourcesList);
        Str = "";
        if (source.field_2._12_4_ + 1 < sVar3) {
          Str = ",";
        }
        prVar7 = llvm::raw_ostream::operator<<(prVar7,Str);
        llvm::raw_ostream::operator<<(prVar7,"\n");
        llvm::SmallString<16U>::~SmallString((SmallString<16U> *)local_500);
        llvm::SmallString<16U>::~SmallString((SmallString<16U> *)local_480);
        std::__cxx11::string::~string((string *)&objectDir.Length);
        std::__cxx11::string::~string((string *)(object_1.field_2._M_local_buf + 8));
        source.field_2._12_4_ = source.field_2._12_4_ + 1;
      }
      __fd = 0x352357;
      llvm::raw_ostream::operator<<((raw_ostream *)local_f0,"}\n");
      llvm::raw_fd_ostream::close((raw_fd_ostream *)local_f0,__fd);
      ti_local.ctx._7_1_ = true;
      masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts
      [0xc].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x1;
      masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts
      [0xd].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts
      [0xe].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      masterDepsPath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts
      [0xf].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      llvm::SmallString<16U>::~SmallString((SmallString<16U> *)local_1a8);
    }
    llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_f0);
    llvm::SmallString<16U>::~SmallString((SmallString<16U> *)&ec._M_cat);
    return ti_local.ctx._7_1_;
  }
  __assert_fail("sourcesList.size() == objectsList.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                ,0xad6,
                "bool (anonymous namespace)::SwiftCompilerShellCommand::writeOutputFileMap(TaskInterface, StringRef, std::vector<std::string> &) const"
               );
}

Assistant:

bool writeOutputFileMap(TaskInterface ti,
                          StringRef outputFileMapPath,
                          std::vector<std::string>& depsFiles_out) const {
    assert(sourcesList.size() == objectsList.size());

    SmallString<16> data;
    std::error_code ec;
    llvm::raw_fd_ostream os(outputFileMapPath, ec,
                            llvm::sys::fs::OpenFlags::F_Text);
    if (ec) {
      getBuildSystem(ti).getDelegate().commandHadError((Command*)this,
                      "unable to create output file map: '" + outputFileMapPath.str() + "'");
      return false;
    }

    os << "{\n";

    // Write the master file dependencies entry.
    SmallString<16> masterDepsPath;
    llvm::sys::path::append(masterDepsPath, tempsPath, "master.swiftdeps");
    os << "  \"\": {\n";
    if (enableWholeModuleOptimization) {
      SmallString<16> depsPath;
      llvm::sys::path::append(depsPath, tempsPath, moduleName + ".d");
      depsFiles_out.push_back(depsPath.str());
      SmallString<16> object;
      llvm::sys::path::append(object, tempsPath, moduleName + ".o");
      os << "    \"dependencies\": \"" << escapeForJSON(depsPath) << "\",\n";
      os << "    \"object\": \"" << escapeForJSON(object) << "\",\n";
    }
    os << "    \"swift-dependencies\": \"" << escapeForJSON(masterDepsPath) << "\"\n";
    os << "  },\n";

    // Write out the entries for each source file.
    for (unsigned i = 0; i != sourcesList.size(); ++i) {
      auto source = sourcesList[i];
      auto object = objectsList[i];
      auto objectDir = llvm::sys::path::parent_path(object);
      auto sourceStem = llvm::sys::path::stem(source);
      SmallString<16> partialModulePath;
      llvm::sys::path::append(partialModulePath, objectDir,
                              sourceStem + "~partial.swiftmodule");
      SmallString<16> swiftDepsPath;
      llvm::sys::path::append(swiftDepsPath, objectDir,
                              sourceStem + ".swiftdeps");

      os << "  \"" << escapeForJSON(source) << "\": {\n";
      if (!enableWholeModuleOptimization) {
        SmallString<16> depsPath;
        llvm::sys::path::append(depsPath, objectDir, sourceStem + ".d");
        os << "    \"dependencies\": \"" << escapeForJSON(depsPath) << "\",\n";
        depsFiles_out.push_back(depsPath.str());
      }
      os << "    \"object\": \"" << escapeForJSON(object) << "\",\n";
      os << "    \"swiftmodule\": \"" << escapeForJSON(partialModulePath) << "\",\n";
      os << "    \"swift-dependencies\": \"" << escapeForJSON(swiftDepsPath) << "\"\n";
      os << "  }" << ((i + 1) < sourcesList.size() ? "," : "") << "\n";
    }

    os << "}\n";

    os.close();

    return true;
  }